

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.c
# Opt level: O0

void attoAppInit(AAppProctable *proctable)

{
  char *pcVar1;
  uint local_14;
  int i;
  AAppProctable *proctable_local;
  
  aAppDebugPrintf("%s[%u]: argc = %d, argv = %p","attoAppInit",0,(ulong)(uint)a_app_state->argc,
                  a_app_state->argv);
  for (local_14 = 0; (int)local_14 < a_app_state->argc; local_14 = local_14 + 1) {
    aAppDebugPrintf("\targv[%d] = \'%s\'",(ulong)local_14,a_app_state->argv[(int)local_14]);
  }
  pcVar1 = opengl_version(a_app_state->gl_version);
  aAppDebugPrintf("\tOpenGL version %s",pcVar1);
  proctable->resize = appResize;
  proctable->paint = appPaint;
  proctable->key = appKeyPress;
  proctable->pointer = appPointer;
  proctable->close = appClose;
  return;
}

Assistant:

void attoAppInit(struct AAppProctable *proctable) {
	int i;
	aAppDebugPrintf("%s[%u]: argc = %d, argv = %p", __func__, 0, a_app_state->argc, (void *)a_app_state->argv);
	for (i = 0; i < a_app_state->argc; ++i) aAppDebugPrintf("\targv[%d] = '%s'", i, a_app_state->argv[i]);
	aAppDebugPrintf("\tOpenGL version %s", opengl_version(a_app_state->gl_version));

	proctable->resize = appResize;
	proctable->paint = appPaint;
	proctable->key = appKeyPress;
	proctable->pointer = appPointer;
	proctable->close = appClose;
}